

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O3

void testwin4(wins *wins_ar,int ar_len)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  Am_Style local_a0 [8];
  char new_title [100];
  
  if (ar_len < 1) {
    printf("Type a new name for the blue window: ");
    __isoc99_scanf("%s",new_title);
    getchar();
  }
  else {
    lVar6 = (ulong)(uint)ar_len << 6;
    lVar5 = 0;
    do {
      puVar1 = *(undefined8 **)((long)&wins_ar->root + lVar5);
      Am_Style::Am_Style(local_a0,(Am_Style *)&blue);
      uVar3 = (**(code **)*puVar1)
                        (puVar1,900,0xa0,200,200,"D4","D4 Icon",1,0,local_a0,0,100,100,300,300,1,1,0
                         ,1,0);
      *(undefined8 *)((long)&wins_ar->d4 + lVar5) = uVar3;
      Am_Style::~Am_Style(local_a0);
      lVar5 = lVar5 + 0x40;
    } while (lVar6 != lVar5);
    printf("Type a new name for the blue window: ");
    __isoc99_scanf("%s",new_title);
    getchar();
    if (0 < ar_len) {
      lVar5 = 0;
      do {
        plVar2 = *(long **)((long)&wins_ar->d4 + lVar5);
        (**(code **)(*plVar2 + 0x40))(plVar2,new_title);
        lVar5 = lVar5 + 0x40;
      } while (lVar6 != lVar5);
      if (0 < ar_len) {
        lVar5 = 0;
        do {
          sVar4 = strlen(new_title);
          builtin_strncpy(new_title + sVar4," Icon",6);
          plVar2 = *(long **)((long)&wins_ar->d4 + lVar5);
          (**(code **)(*plVar2 + 0x48))(plVar2,new_title);
          (**(code **)(**(long **)((long)&wins_ar->d4 + lVar5) + 0xa0))();
          lVar5 = lVar5 + 0x40;
        } while ((ulong)(uint)ar_len << 6 != lVar5);
      }
    }
  }
  return;
}

Assistant:

void
testwin4(wins *wins_ar, int ar_len)
{
  //printf("Hit RETURN to bring up blue user-positioned window:");
  //getchar();

  int i;
  for (i = 0; i < ar_len; i++) {
    wins_ar[i].d4 = (wins_ar[i].root)
                        ->Create(TESTWINPROPS_D4_LEFT, TESTWINPROPS_D4_TOP, 200,
                                 200, "D4", "D4 Icon", true, false, blue, false,
                                 // Min width and height
                                 100, 100,
                                 // Max width and height
                                 300, 300,
                                 // Want a title bar
                                 true,
                                 // Query user for position
                                 true);
  }

  //  printf("Hit RETURN to change the title of the blue window: ");
  //  getchar ();
  //  char new_title[17];
  //  new_title = "Blue Window";

  char new_title[100];
  printf("Type a new name for the blue window: ");
  scanf("%s", new_title);
  getchar(); // Eat carriage return

  for (i = 0; i < ar_len; i++) {
    (wins_ar[i].d4)->Set_Title(new_title);
  }
  for (i = 0; i < ar_len; i++) {
    strcat(new_title, " Icon");
    (wins_ar[i].d4)->Set_Icon_Title(new_title);
    (wins_ar[i].d4)->Flush_Output();
  }
}